

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O1

EventListHandle EventListCreate(EventHandler event_handler,uint stack_size)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)malloc(0x80);
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)0x0;
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      puVar2 = (undefined8 *)0x0;
      LogWrite(0,"event_list","EventListCreate",0xcd,"malloc failed !");
    }
  }
  else {
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    puVar2[0xb] = 0;
    puVar2[0xe] = 0;
    puVar2[0xf] = 0;
    puVar2[0xc] = 0;
    puVar2[0xd] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    *puVar2 = puVar2;
    puVar2[1] = puVar2;
    puVar2[2] = puVar2 + 2;
    puVar2[3] = puVar2 + 2;
    puVar2[4] = puVar2 + 4;
    puVar2[5] = puVar2 + 4;
    puVar2[8] = event_handler;
    puVar2[9] = _highest_interruptable_handler;
    puVar2[10] = _medium_interruptable_handler;
    puVar2[0xb] = _lowest_interruptable_handler;
    uni_sem_new(puVar2 + 0xd,0);
    uni_sem_new(puVar2 + 0xe,0);
    uni_mutex_new(puVar2 + 0xc);
    *(undefined4 *)(puVar2 + 0xf) = 1;
    iVar1 = uni_thread_new("event_list",_event_handler,puVar2,stack_size);
    if (iVar1 != 0) {
      __assert_fail("ret == OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/junlon2006[P]voice_iot_sdk/utils/event_list/src/uni_event_list.c"
                    ,199,"void _worker_thread_create(EventList *, unsigned int)");
    }
  }
  return puVar2;
}

Assistant:

EventListHandle EventListCreate(EventHandler event_handler, unsigned int stack_size) {
  EventList *event_list;
  if (NULL == (event_list = (EventList *)uni_malloc(sizeof(EventList)))) {
    LOGE(TAG, "malloc failed !");
    return NULL;
  }

  _mzero_event_list(event_list);
  _list_init(event_list);
  _register_event_handler(event_list, event_handler);
  _register_interuppt_handler(event_list);
  _worker_thread_create(event_list, stack_size);
  return event_list;
}